

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O1

void UA_SecureChannel_revolveTokens(UA_SecureChannel *channel)

{
  UA_DateTime UVar1;
  undefined4 uVar2;
  UA_UInt32 UVar3;
  
  if ((channel->nextSecurityToken).tokenId != 0) {
    uVar2 = *(undefined4 *)&(channel->nextSecurityToken).field_0x14;
    (channel->securityToken).revisedLifetime = (channel->nextSecurityToken).revisedLifetime;
    *(undefined4 *)&(channel->securityToken).field_0x14 = uVar2;
    UVar3 = (channel->nextSecurityToken).tokenId;
    UVar1 = (channel->nextSecurityToken).createdAt;
    (channel->securityToken).channelId = (channel->nextSecurityToken).channelId;
    (channel->securityToken).tokenId = UVar3;
    (channel->securityToken).createdAt = UVar1;
    (channel->nextSecurityToken).channelId = 0;
    (channel->nextSecurityToken).tokenId = 0;
    (channel->nextSecurityToken).createdAt = 0;
    *(undefined8 *)&(channel->nextSecurityToken).revisedLifetime = 0;
  }
  return;
}

Assistant:

void UA_SecureChannel_revolveTokens(UA_SecureChannel *channel) {
    if(channel->nextSecurityToken.tokenId == 0) //no security token issued
        return;

    //FIXME: not thread-safe
    memcpy(&channel->securityToken, &channel->nextSecurityToken,
           sizeof(UA_ChannelSecurityToken));
    UA_ChannelSecurityToken_init(&channel->nextSecurityToken);
}